

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest11::testDraw
          (FunctionalTest11 *this,GLuint *routine_configuration,GLuint *sampler_configuration,
          GLubyte *expected_color,texture *color_texture)

{
  GLuint GVar1;
  GLuint GVar2;
  GLuint i_1;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  long lVar6;
  pointer puVar7;
  GLuint i;
  ulong uVar8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> captured_data;
  GLuint subroutine_indices [5];
  long lVar5;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  for (uVar8 = 0; uVar8 != 2; uVar8 = uVar8 + 1) {
    GVar1 = this->m_uniform_locations[uVar8];
    GVar2 = this->m_source_textures[sampler_configuration[uVar8]];
    (**(code **)(lVar5 + 8))((uint)uVar8 | 0x84c0);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"ActiveTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x1698);
    (**(code **)(lVar5 + 0xb8))(0xde1,GVar2);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x169b);
    (**(code **)(lVar5 + 0x14f0))(GVar1,uVar8 & 0xffffffff);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"Uniform1i",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x169e);
  }
  (**(code **)(lVar5 + 8))(0x84c0);
  for (lVar6 = 0; lVar6 != 5; lVar6 = lVar6 + 1) {
    subroutine_indices[this->m_subroutine_uniform_locations[lVar6]] =
         this->m_subroutine_indices[lVar6][routine_configuration[lVar6]];
  }
  (**(code **)(lVar5 + 0x1668))(0x8b30,5,subroutine_indices);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"UniformSubroutinesuiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x16ad);
  (**(code **)(lVar5 + 0x538))(0,0,1);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"DrawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x16b1);
  captured_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  captured_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  captured_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&captured_data,0x1000);
  Utils::texture::get(color_texture,0x1908,0x1401,
                      captured_data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
  puVar7 = captured_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + 3;
  for (uVar8 = 0; uVar8 != 0x20; uVar8 = uVar8 + 1) {
    lVar5 = 0;
    while (lVar5 != 0x20) {
      if ((((*expected_color != puVar7[lVar5 * 4 + -3]) ||
           (expected_color[1] != puVar7[lVar5 * 4 + -2])) ||
          (expected_color[2] != puVar7[lVar5 * 4 + -1])) ||
         (lVar6 = lVar5 * 4, lVar5 = lVar5 + 1, expected_color[3] != puVar7[lVar6]))
      goto LAB_00a1f095;
    }
    puVar7 = puVar7 + 0x80;
  }
LAB_00a1f095:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&captured_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return 0x1f < uVar8;
}

Assistant:

bool FunctionalTest11::testDraw(const glw::GLuint routine_configuration[5], const glw::GLuint sampler_configuration[2],
								const glw::GLubyte expected_color[4], Utils::texture& color_texture) const
{
	const glw::Functions& gl					= m_context.getRenderContext().getFunctions();
	static const GLint	n_samplers			= 2;
	static const GLint	n_subroutine_uniforms = 5;
	GLuint				  subroutine_indices[5];

	/* Set samplers */
	for (GLuint i = 0; i < n_samplers; ++i)
	{
		const GLuint location = m_uniform_locations[i];
		const GLuint texture  = m_source_textures[sampler_configuration[i]];

		gl.activeTexture(GL_TEXTURE0 + i);
		GLU_EXPECT_NO_ERROR(gl.getError(), "ActiveTexture");

		gl.bindTexture(GL_TEXTURE_2D, texture);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

		gl.uniform1i(location, i);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform1i");
	}

	gl.activeTexture(GL_TEXTURE0 + 0);

	/* Set subroutine uniforms */
	for (GLuint i = 0; i < n_subroutine_uniforms; ++i)
	{
		const GLuint location = m_subroutine_uniform_locations[i];
		const GLuint routine  = routine_configuration[i];

		subroutine_indices[location] = m_subroutine_indices[i][routine];
	}

	gl.uniformSubroutinesuiv(GL_FRAGMENT_SHADER, 5, subroutine_indices);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UniformSubroutinesuiv");

	/* Draw */
	gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays");

	/* Capture result */
	std::vector<GLubyte> captured_data;
	captured_data.resize(m_texture_width * m_texture_height * 4);

	color_texture.get(GL_RGBA, GL_UNSIGNED_BYTE, &captured_data[0]);

	/* Verify result */
	for (GLuint y = 0; y < m_texture_height; ++y)
	{
		const GLuint line_offset = y * m_texture_width * 4;

		for (GLuint x = 0; x < m_texture_width; ++x)
		{
			const GLuint point_offset   = x * 4 + line_offset;
			bool		 is_as_expected = true;

			is_as_expected = is_as_expected && (expected_color[0] == captured_data[point_offset + 0]); /* red */
			is_as_expected = is_as_expected && (expected_color[1] == captured_data[point_offset + 1]); /* green */
			is_as_expected = is_as_expected && (expected_color[2] == captured_data[point_offset + 2]); /* blue */
			is_as_expected = is_as_expected && (expected_color[3] == captured_data[point_offset + 3]); /* alpha */

			if (false == is_as_expected)
			{
				return false;
			}
		}
	}

	/* Done */
	return true;
}